

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O1

void transread(quadtype nextquad)

{
  fwrite("; read ",7,1,(FILE *)ofp);
  fprintlexeme(ofp,nextquad.opcode);
  fputc(10,(FILE *)ofp);
  fwrite("         call      Readint\n",0x1b,1,(FILE *)ofp);
  emittoone(opcmov,nextquad.opcode,"cx");
  fputc(10,(FILE *)ofp);
  return;
}

Assistant:

void    transread(struct quadtype nextquad)
{
    fprintf(ofp, "; read ");
    fprintlexeme(ofp, nextquad.op1.opnd);
    fprintf(ofp, "\n");
    
    fprintf(ofp, "         call      Readint\n");
    emittoone(opcmov, nextquad.op1.opnd, "cx");
    fprintf(ofp, "\n");
}